

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O2

void __thiscall Image::fillSides(Image *this)

{
  long lVar1;
  int y;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  for (y = 0; y < *(int *)&this->field_0x8; y = y + 1) {
    lVar1 = *(long *)&this->field_0x10;
    uVar4 = *(uint *)&this->field_0xc;
    iVar3 = uVar4 * y;
    lVar2 = lVar1 + iVar3;
    for (lVar6 = 0; (lVar6 < (int)uVar4 && (*(char *)(lVar2 + lVar6) == -1)); lVar6 = lVar6 + 1) {
      *(undefined1 *)(lVar2 + lVar6) = 0;
      uVar4 = *(uint *)&this->field_0xc;
    }
    lVar2 = lVar1 + iVar3 + -1;
    for (uVar5 = (ulong)uVar4; (0 < (int)uVar5 && (*(char *)(lVar2 + uVar5) == -1));
        uVar5 = uVar5 - 1) {
      *(undefined1 *)(lVar2 + uVar5) = 0;
    }
  }
  return;
}

Assistant:

void Image::fillSides() {
  // Fill the contour with black pixels (left side)
  for (auto y = 0; y < m_.rows; y++) {
    uint8_t* data = (uint8_t*) m_.data + y * m_.cols;
    for (auto x = 0; x < m_.cols; x++) {
      if (data[x] == 0xff) {
        data[x] = 0x00;
      } else {
        break;
      }
    }
    for (auto x = m_.cols - 1; x >= 0; x--) {
      if (data[x] == 0xff) {
        data[x] = 0x00;
      } else {
        break;
      }
    }
  }
}